

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O0

size_t mdns_records_parse(sockaddr *from,void *buffer,size_t size,size_t *offset,
                         mdns_entry_type_t type,size_t records,mdns_record_callback_fn callback,
                         void *user_data)

{
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  int iVar6;
  uint16_t *puVar7;
  uint16_t length;
  uint32_t ttl;
  uint16_t rclass;
  uint16_t rtype;
  uint16_t *data;
  size_t i;
  size_t sStack_50;
  int do_callback;
  size_t parsed;
  size_t records_local;
  mdns_entry_type_t type_local;
  size_t *offset_local;
  size_t size_local;
  void *buffer_local;
  sockaddr *from_local;
  
  sStack_50 = 0;
  bVar1 = true;
  for (data = (uint16_t *)0x0; data < records; data = (uint16_t *)((long)data + 1)) {
    mdns_string_skip(buffer,size,offset);
    puVar7 = (uint16_t *)((long)buffer + *offset);
    uVar2 = ntohs(*puVar7);
    uVar3 = ntohs(puVar7[1]);
    uVar4 = ntohs((uint16_t)*(undefined4 *)(puVar7 + 2));
    uVar5 = ntohs(puVar7[4]);
    *offset = *offset + 10;
    if (bVar1) {
      sStack_50 = sStack_50 + 1;
      iVar6 = (*callback)(from,type,uVar2,uVar3,(uint32_t)uVar4,buffer,size,*offset,(size_t)uVar5,
                          user_data);
      if (iVar6 != 0) {
        bVar1 = false;
      }
    }
    *offset = (ulong)uVar5 + *offset;
  }
  return sStack_50;
}

Assistant:

size_t
mdns_records_parse(const struct sockaddr* from, const void* buffer, size_t size, size_t* offset,
                   mdns_entry_type_t type, size_t records, mdns_record_callback_fn callback,
                   void* user_data) {
	size_t parsed = 0;
	int do_callback = 1;
	for (size_t i = 0; i < records; ++i) {
		mdns_string_skip(buffer, size, offset);
		const uint16_t* data = (const uint16_t*)((const char*)buffer + (*offset));

		uint16_t rtype = ntohs(*data++);
		uint16_t rclass = ntohs(*data++);
		uint32_t ttl = ntohs(*(const uint32_t*)(const void*)data); data += 2;
		uint16_t length = ntohs(*data++);

		*offset += 10;

		if (do_callback) {
			++parsed;
			if (callback(from, type, rtype, rclass, ttl, buffer, size, *offset, length,
			             user_data))
				do_callback = 0;
		}

		*offset += length;
	}
	return parsed;
}